

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunctionType.cpp
# Opt level: O2

ScriptFunctionType * Js::ScriptFunctionType::New(FunctionProxy *proxy,bool isShared)

{
  JavascriptLibrary *this;
  DynamicObject *prototype;
  bool bVar1;
  int iVar2;
  ScriptContext *pSVar3;
  undefined4 extraout_var;
  DynamicTypeHandler *typeHandler;
  ScriptFunctionType *pSVar4;
  Type *pTVar5;
  
  pSVar3 = FunctionProxy::GetScriptContext(proxy);
  this = (pSVar3->super_ScriptContextBase).javascriptLibrary;
  bVar1 = FunctionProxy::IsAsync(proxy);
  pTVar5 = &(this->super_JavascriptLibraryBase).functionPrototype;
  if (bVar1) {
    pTVar5 = &(this->super_JavascriptLibraryBase).asyncFunctionPrototype;
  }
  prototype = pTVar5->ptr;
  bVar1 = FunctionProxy::IsConstructor(proxy);
  iVar2 = (*(proxy->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[7])(proxy);
  typeHandler = JavascriptLibrary::ScriptFunctionTypeHandler
                          (this,!bVar1,
                           (char16 *)CONCAT44(extraout_var,iVar2) == L"Anonymous function");
  pSVar4 = New(proxy,typeHandler,&prototype->super_RecyclableObject,isShared);
  return pSVar4;
}

Assistant:

ScriptFunctionType * ScriptFunctionType::New(FunctionProxy * proxy, bool isShared)
    {
        ScriptContext * scriptContext = proxy->GetScriptContext();
        JavascriptLibrary * library = scriptContext->GetLibrary();
        DynamicObject * functionPrototype = proxy->IsAsync() ? library->GetAsyncFunctionPrototype() : library->GetFunctionPrototype();
        DynamicTypeHandler * typeHandler = library->ScriptFunctionTypeHandler(!proxy->IsConstructor(), proxy->GetIsAnonymousFunction());

        return New(proxy, typeHandler, functionPrototype, isShared);
    }